

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

ON_3dVector * __thiscall ON_Triangle::Normal(ON_3dVector *__return_storage_ptr__,ON_Triangle *this)

{
  double dVar1;
  uint uVar2;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ON_3dVector W;
  ON_3dVector V;
  ON_3dVector local_78;
  ON_Line local_60;
  
  iVar10 = 2;
  uVar14 = 0;
  uVar16 = 0xbff00000;
  uVar9 = 0;
  uVar12 = 0;
  do {
    uVar11 = uVar9 + 1;
    bVar13 = iVar10 == 0;
    iVar10 = iVar10 + -1;
    uVar7 = (ulong)uVar11;
    if (bVar13) {
      uVar7 = 0;
    }
    iVar8 = uVar9 - 1;
    if (uVar9 == 0) {
      iVar8 = 2;
    }
    uVar5 = this->m_V[iVar8].x;
    uVar6 = this->m_V[iVar8].y;
    to_pt.y = (double)uVar6;
    to_pt.x = (double)uVar5;
    uVar3 = this->m_V[uVar7].x;
    uVar4 = this->m_V[uVar7].y;
    from_pt.y = (double)uVar4;
    from_pt.x = (double)uVar3;
    from_pt.z = this->m_V[uVar7].z;
    to_pt.z = this->m_V[iVar8].z;
    ON_Line::ON_Line(&local_60,from_pt,to_pt);
    ON_Line::Direction(&local_78,&local_60);
    ON_Line::~ON_Line(&local_60);
    dVar1 = ON_3dVector::MaximumCoordinate(&local_78);
    uVar15 = SUB84(dVar1,0);
    uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
    uVar2 = uVar9;
    if (dVar1 <= (double)CONCAT44(uVar16,uVar14)) {
      uVar15 = uVar14;
      uVar17 = uVar16;
      uVar2 = uVar12;
    }
    uVar14 = uVar15;
    uVar16 = uVar17;
    uVar9 = uVar11;
    uVar12 = uVar2;
  } while (uVar11 != 3);
  ON_3dPoint::operator-
            ((ON_3dVector *)&local_60,this->m_V + (int)(((int)(uVar2 + 1) / 3) * -3 + uVar2 + 1),
             this->m_V + (int)uVar2);
  ON_3dPoint::operator-
            (&local_78,this->m_V + (int)(((int)(uVar2 + 2) / 3) * -3 + uVar2 + 2),
             this->m_V + (int)uVar2);
  ON_CrossProduct(__return_storage_ptr__,(ON_3dVector *)&local_60,&local_78);
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Triangle::Normal() const
{
	int i0 = 0; // base vetex for computation s/b opposite longest side
									 // too minimize roundoff 
									 // ( see Kahan https://people.eecs.berkeley.edu/~wkahan/MathH110/Cross.pdf).
	double max_len = -1;
	for (int i = 0; i < 3; i++)
	{
		ON_3dVector V = Edge(i).Direction();
		double normV = V.MaximumCoordinate();
		if (normV > max_len)
		{
			max_len = normV;
			i0 = i;
		}
	}

	ON_3dVector V = m_V[(i0 + 1)%3] - m_V[i0];
	ON_3dVector W = m_V[(i0 + 2)%3] - m_V[i0];

	return ON_CrossProduct(V, W);
}